

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O2

xmlOutputBufferPtr xmlAllocOutputBuffer(xmlCharEncodingHandlerPtr encoder)

{
  xmlOutputBufferPtr out;
  xmlBufPtr pxVar1;
  
  out = (xmlOutputBufferPtr)(*xmlMalloc)(0x38);
  if (out == (xmlOutputBufferPtr)0x0) {
    xmlCharEncCloseFunc(encoder);
  }
  else {
    out->buffer = (xmlBufPtr)0x0;
    out->conv = (xmlBufPtr)0x0;
    out->closecallback = (xmlOutputCloseCallback)0x0;
    out->encoder = (xmlCharEncodingHandlerPtr)0x0;
    out->context = (void *)0x0;
    out->writecallback = (xmlOutputWriteCallback)0x0;
    out->written = 0;
    out->error = 0;
    pxVar1 = xmlBufCreate(4000);
    out->buffer = pxVar1;
    if (pxVar1 != (xmlBufPtr)0x0) {
      out->encoder = encoder;
      if (encoder == (xmlCharEncodingHandlerPtr)0x0) {
        out->conv = (xmlBufPtr)0x0;
      }
      else {
        pxVar1 = xmlBufCreate(4000);
        out->conv = pxVar1;
        if (pxVar1 == (xmlBufPtr)0x0) {
          xmlOutputBufferClose(out);
          return (xmlOutputBufferPtr)0x0;
        }
        xmlCharEncOutput(out,1);
      }
      out->written = 0;
      out->context = (void *)0x0;
      out->writecallback = (xmlOutputWriteCallback)0x0;
      out->closecallback = (xmlOutputCloseCallback)0x0;
      return out;
    }
    xmlCharEncCloseFunc(encoder);
    (*xmlFree)(out);
  }
  return (xmlOutputBufferPtr)0x0;
}

Assistant:

xmlOutputBufferPtr
xmlAllocOutputBuffer(xmlCharEncodingHandlerPtr encoder) {
    xmlOutputBufferPtr ret;

    ret = (xmlOutputBufferPtr) xmlMalloc(sizeof(xmlOutputBuffer));
    if (ret == NULL) {
        xmlCharEncCloseFunc(encoder);
	return(NULL);
    }
    memset(ret, 0, sizeof(xmlOutputBuffer));
    ret->buffer = xmlBufCreate(MINLEN);
    if (ret->buffer == NULL) {
        xmlCharEncCloseFunc(encoder);
        xmlFree(ret);
	return(NULL);
    }

    ret->encoder = encoder;
    if (encoder != NULL) {
        ret->conv = xmlBufCreate(MINLEN);
	if (ret->conv == NULL) {
            xmlOutputBufferClose(ret);
	    return(NULL);
	}

	/*
	 * This call is designed to initiate the encoder state
	 */
	xmlCharEncOutput(ret, 1);
    } else
        ret->conv = NULL;
    ret->writecallback = NULL;
    ret->closecallback = NULL;
    ret->context = NULL;
    ret->written = 0;

    return(ret);
}